

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkobj.c
# Opt level: O0

obj * splitobj(obj *obj,long num)

{
  boolean bVar1;
  uint uVar2;
  obj *obj_00;
  obj *otmp;
  long num_local;
  obj *obj_local;
  
  if (((obj->cobj == (obj *)0x0) && (0 < num)) && (num < obj->quan)) {
    obj_00 = (obj *)malloc((ulong)((int)obj->oxlth + (uint)obj->onamelth) + 0x68);
    memcpy(obj_00,obj,0x68);
    uVar2 = flags.ident + 1;
    obj_00->o_id = flags.ident;
    flags.ident = uVar2;
    if (obj_00->o_id == 0) {
      uVar2 = flags.ident + 1;
      obj_00->o_id = flags.ident;
      flags.ident = uVar2;
    }
    obj_00->timed = '\0';
    *(uint *)&obj_00->field_0x4a = *(uint *)&obj_00->field_0x4a & 0xfff7ffff;
    obj_00->owornmask = 0;
    obj->quan = obj->quan - (int)num;
    uVar2 = weight(obj);
    obj->owt = uVar2;
    obj_00->quan = (int)num;
    uVar2 = weight(obj_00);
    obj_00->owt = uVar2;
    obj->nobj = obj_00;
    if (obj->where == '\x01') {
      (obj->v).v_nexthere = obj_00;
    }
    if (obj->oxlth != 0) {
      memcpy(obj_00->oextra,obj->oextra,(long)obj->oxlth);
    }
    if (obj->onamelth != '\0') {
      strncpy((char *)((long)obj_00->oextra + (long)(int)obj_00->oxlth),
              (char *)((long)obj->oextra + (long)(int)obj->oxlth),(long)(int)(uint)obj->onamelth);
    }
    if ((*(uint *)&obj->field_0x4a >> 2 & 1) != 0) {
      splitbill(obj,obj_00);
    }
    if (obj->timed != '\0') {
      obj_split_timers(obj,obj_00);
    }
    bVar1 = obj_sheds_light(obj);
    if (bVar1 != '\0') {
      obj_split_light_source(obj,obj_00);
    }
    return obj_00;
  }
  panic("splitobj");
}

Assistant:

struct obj *splitobj(struct obj *obj, long num)
{
	struct obj *otmp;

	if (obj->cobj || num <= 0L || obj->quan <= num)
	    panic("splitobj");	/* can't split containers */
	otmp = newobj(obj->oxlth + obj->onamelth);
	*otmp = *obj;		/* copies whole structure */
	otmp->o_id = flags.ident++;
	if (!otmp->o_id) otmp->o_id = flags.ident++;	/* ident overflowed */
	otmp->timed = 0;	/* not timed, yet */
	otmp->lamplit = 0;	/* ditto */
	otmp->owornmask = 0L;	/* new object isn't worn */
	obj->quan -= num;
	obj->owt = weight(obj);
	otmp->quan = num;
	otmp->owt = weight(otmp);	/* -= obj->owt ? */
	obj->nobj = otmp;
	/* Only set nexthere when on the floor, nexthere is also used */
	/* as a back pointer to the container object when contained. */
	if (obj->where == OBJ_FLOOR)
	    obj->nexthere = otmp;
	if (obj->oxlth)
	    memcpy(otmp->oextra, (void *)obj->oextra,
			obj->oxlth);
	if (obj->onamelth)
	    strncpy(ONAME(otmp), ONAME(obj), (int)obj->onamelth);
	if (obj->unpaid) splitbill(obj,otmp);
	if (obj->timed) obj_split_timers(obj, otmp);
	if (obj_sheds_light(obj)) obj_split_light_source(obj, otmp);
	return otmp;
}